

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O3

char * fai_fetch(faidx_t *fai,char *str,int *len)

{
  uint uVar1;
  kh_s_t *pkVar2;
  ushort *puVar3;
  khint32_t *pkVar4;
  faidx1_t *pfVar5;
  uint64_t uVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  char *pcVar14;
  ushort **ppuVar15;
  byte bVar16;
  char *pcVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint local_58;
  
  pkVar2 = fai->hash;
  sVar13 = strlen(str);
  uVar25 = (uint)sVar13;
  pcVar14 = (char *)malloc((long)(int)(uVar25 + 1));
  if ((int)uVar25 < 1) {
    uVar21 = 0;
  }
  else {
    ppuVar15 = __ctype_b_loc();
    puVar3 = *ppuVar15;
    uVar18 = 0;
    uVar21 = 0;
    do {
      if ((*(byte *)((long)puVar3 + (long)str[uVar18] * 2 + 1) & 0x20) == 0) {
        lVar20 = (long)(int)uVar21;
        uVar21 = uVar21 + 1;
        pcVar14[lVar20] = str[uVar18];
      }
      uVar18 = uVar18 + 1;
    } while ((uVar25 & 0x7fffffff) != uVar18);
  }
  pcVar14[(int)uVar21] = '\0';
  uVar26 = uVar21;
  uVar23 = uVar21;
  do {
    uVar23 = uVar23 - 1;
    local_58 = uVar25;
    if ((int)uVar26 < 1) break;
    local_58 = uVar26 - 1;
    uVar26 = local_58;
  } while (pcVar14[uVar23] != ':');
  if ((int)uVar21 <= (int)local_58) {
    uVar25 = pkVar2->n_buckets;
    if (uVar25 != 0) {
      uVar23 = (uint)*str;
      if (*str == '\0') {
        uVar23 = 0;
      }
      else {
        cVar8 = str[1];
        if (cVar8 != '\0') {
          pcVar17 = str + 2;
          do {
            uVar23 = (int)cVar8 + uVar23 * 0x1f;
            cVar8 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while (cVar8 != '\0');
        }
      }
      uVar23 = uVar23 & uVar25 - 1;
      pkVar4 = pkVar2->flags;
      iVar27 = 1;
      uVar26 = uVar23;
      do {
        uVar1 = pkVar4[uVar26 >> 4];
        bVar16 = (char)uVar26 * '\x02' & 0x1e;
        uVar9 = uVar1 >> bVar16;
        if (((uVar9 & 2) != 0) ||
           (((uVar9 & 1) == 0 && (iVar10 = strcmp(pkVar2->keys[uVar26],str), iVar10 == 0)))) {
          uVar18 = (ulong)uVar26;
          if ((uVar1 >> bVar16 & 3) != 0) {
            uVar18 = (ulong)uVar25;
          }
          goto LAB_0013f411;
        }
        uVar26 = uVar26 + iVar27 & uVar25 - 1;
        iVar27 = iVar27 + 1;
      } while (uVar26 != uVar23);
    }
    goto LAB_0013f5d3;
  }
  if ((int)(local_58 + 1) < (int)uVar21) {
    lVar20 = (long)(int)local_58 + 2;
    uVar25 = uVar21 - 1;
    iVar27 = 0;
    bVar7 = true;
    do {
      cVar8 = pcVar14[lVar20 + -1];
      if ((long)cVar8 == 0x2d) {
        iVar27 = iVar27 + 1;
      }
      else {
        ppuVar15 = __ctype_b_loc();
        if ((cVar8 != ',') && (((*ppuVar15)[cVar8] & 0x800) == 0)) break;
      }
      bVar7 = lVar20 < (int)uVar21;
      lVar20 = lVar20 + 1;
      uVar25 = uVar25 - 1;
    } while (local_58 != uVar25);
    if (1 < iVar27) {
      local_58 = uVar21;
    }
    if (bVar7) {
      local_58 = uVar21;
    }
  }
  pcVar14[(int)local_58] = '\0';
  uVar25 = pkVar2->n_buckets;
  if (uVar25 == 0) {
    uVar18 = 0;
LAB_0013f2ff:
    if ((uint)uVar18 == uVar25) goto LAB_0013f308;
  }
  else {
    uVar23 = (uint)*pcVar14;
    if (*pcVar14 == '\0') {
      uVar23 = 0;
    }
    else {
      cVar8 = pcVar14[1];
      if (cVar8 != '\0') {
        pcVar17 = pcVar14 + 2;
        do {
          uVar23 = (int)cVar8 + uVar23 * 0x1f;
          cVar8 = *pcVar17;
          pcVar17 = pcVar17 + 1;
        } while (cVar8 != '\0');
      }
    }
    uVar23 = uVar23 & uVar25 - 1;
    pkVar4 = pkVar2->flags;
    iVar27 = 1;
    uVar26 = uVar23;
    do {
      uVar1 = pkVar4[uVar26 >> 4];
      bVar16 = (char)uVar26 * '\x02' & 0x1e;
      uVar9 = uVar1 >> bVar16;
      if (((uVar9 & 2) != 0) ||
         (((uVar9 & 1) == 0 && (iVar10 = strcmp(pkVar2->keys[uVar26],pcVar14), iVar10 == 0)))) {
        uVar18 = (ulong)uVar26;
        if ((uVar1 >> bVar16 & 3) != 0) {
          uVar18 = (ulong)uVar25;
        }
        goto LAB_0013f2ff;
      }
      uVar26 = uVar26 + iVar27 & uVar25 - 1;
      iVar27 = iVar27 + 1;
    } while (uVar26 != uVar23);
LAB_0013f308:
    if (uVar25 != 0) {
      uVar23 = (uint)*str;
      if (*str == '\0') {
        uVar23 = 0;
      }
      else {
        cVar8 = str[1];
        if (cVar8 != '\0') {
          pcVar17 = str + 2;
          do {
            uVar23 = (int)cVar8 + uVar23 * 0x1f;
            cVar8 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while (cVar8 != '\0');
        }
      }
      uVar23 = uVar23 & uVar25 - 1;
      pkVar4 = pkVar2->flags;
      iVar27 = 1;
      uVar26 = uVar23;
      do {
        uVar1 = pkVar4[uVar26 >> 4];
        bVar16 = (char)uVar26 * '\x02' & 0x1e;
        uVar9 = uVar1 >> bVar16;
        if (((uVar9 & 2) != 0) ||
           (((uVar9 & 1) == 0 && (iVar10 = strcmp(pkVar2->keys[uVar26],str), iVar10 == 0)))) {
          uVar18 = (ulong)uVar26;
          if ((uVar1 >> bVar16 & 3) != 0) {
            uVar18 = (ulong)uVar25;
          }
          goto LAB_0013f3d2;
        }
        uVar26 = uVar26 + iVar27 & uVar25 - 1;
        iVar27 = iVar27 + 1;
      } while (uVar26 != uVar23);
LAB_0013f3d7:
      *len = 0;
      free(pcVar14);
      return (char *)0x0;
    }
    uVar18 = 0;
LAB_0013f3d2:
    if ((uint)uVar18 == uVar25) goto LAB_0013f3d7;
    pcVar14[(int)local_58] = ':';
    local_58 = uVar21;
  }
LAB_0013f411:
  if ((uint)uVar18 != uVar25) {
    pfVar5 = pkVar2->vals;
    iVar27 = pfVar5[uVar18].line_len;
    iVar10 = pfVar5[uVar18].line_blen;
    lVar20 = pfVar5[uVar18].len;
    uVar6 = pfVar5[uVar18].offset;
    iVar24 = (int)lVar20;
    iVar12 = iVar24;
    if ((int)local_58 < (int)uVar21) {
      iVar29 = local_58 + 1;
      iVar28 = iVar29;
      if (iVar29 < (int)uVar21) {
        lVar19 = 1;
        do {
          if (pcVar14[lVar19 + (int)local_58] != ',') {
            lVar22 = (long)iVar28;
            iVar28 = iVar28 + 1;
            pcVar14[lVar22] = pcVar14[lVar19 + (int)local_58];
          }
          lVar19 = lVar19 + 1;
        } while (uVar21 - local_58 != (int)lVar19);
      }
      pcVar14[iVar28] = '\0';
      iVar11 = atoi(pcVar14 + (long)(int)local_58 + 1);
      if (iVar29 == iVar28) {
LAB_0013f4b2:
        if (iVar29 < iVar28) {
          iVar12 = atoi(pcVar14 + (long)iVar29 + 1);
        }
      }
      else {
        pcVar17 = pcVar14 + iVar29;
        do {
          if (*pcVar17 == '-') goto LAB_0013f4b2;
          iVar29 = iVar29 + 1;
          pcVar17 = pcVar17 + 1;
        } while (iVar28 != iVar29);
      }
      iVar11 = iVar11 - (uint)(0 < iVar11);
    }
    else {
      iVar11 = 0;
    }
    if (lVar20 <= iVar11) {
      iVar11 = iVar24;
    }
    if (lVar20 <= iVar12) {
      iVar12 = iVar24;
    }
    if (iVar12 <= iVar11) {
      iVar11 = iVar12;
    }
    free(pcVar14);
    iVar27 = bgzf_useek(fai->bgzf,
                        uVar6 + (long)(iVar11 % iVar10) + (long)(iVar11 / iVar10) * (long)iVar27,0);
    if (iVar27 < 0) {
      fai_fetch_cold_1();
      return (char *)0x0;
    }
    iVar12 = iVar12 - iVar11;
    pcVar14 = (char *)malloc((long)(iVar12 + 2));
    uVar25 = bgzf_getc(fai->bgzf);
    iVar27 = 0;
    if ((-1 < (int)uVar25) && (iVar27 = 0, 0 < iVar12)) {
      iVar27 = 0;
      ppuVar15 = __ctype_b_loc();
      do {
        if ((short)(*ppuVar15)[uVar25] < 0) {
          lVar20 = (long)iVar27;
          iVar27 = iVar27 + 1;
          pcVar14[lVar20] = (char)uVar25;
        }
        uVar25 = bgzf_getc(fai->bgzf);
      } while ((-1 < (int)uVar25) && (iVar27 < iVar12));
    }
    pcVar14[iVar27] = '\0';
    *len = iVar27;
    return pcVar14;
  }
LAB_0013f5d3:
  fprintf(_stderr,
          "[fai_fetch] Warning - Reference %s not found in FASTA file, returning empty sequence\n",
          str);
  free(pcVar14);
  *len = -2;
  return (char *)0x0;
}

Assistant:

char *fai_fetch(const faidx_t *fai, const char *str, int *len)
{
    char *s;
    int c, i, l, k, name_end;
    khiter_t iter;
    faidx1_t val;
    khash_t(s) *h;
    int beg, end;

    beg = end = -1;
    h = fai->hash;
    name_end = l = strlen(str);
    s = (char*)malloc(l+1);
    // remove space
    for (i = k = 0; i < l; ++i)
        if (!isspace(str[i])) s[k++] = str[i];
    s[k] = 0; l = k;
    // determine the sequence name
    for (i = l - 1; i >= 0; --i) if (s[i] == ':') break; // look for colon from the end
    if (i >= 0) name_end = i;
    if (name_end < l) { // check if this is really the end
        int n_hyphen = 0;
        for (i = name_end + 1; i < l; ++i) {
            if (s[i] == '-') ++n_hyphen;
            else if (!isdigit(s[i]) && s[i] != ',') break;
        }
        if (i < l || n_hyphen > 1) name_end = l; // malformated region string; then take str as the name
        s[name_end] = 0;
        iter = kh_get(s, h, s);
        if (iter == kh_end(h)) { // cannot find the sequence name
            iter = kh_get(s, h, str); // try str as the name
            if (iter == kh_end(h)) {
                *len = 0;
            free(s); return 0;
            } else s[name_end] = ':', name_end = l;
        }
    } else iter = kh_get(s, h, str);
    if(iter == kh_end(h)) {
        fprintf(stderr, "[fai_fetch] Warning - Reference %s not found in FASTA file, returning empty sequence\n", str);
        free(s);
        *len = -2;
        return 0;
    };
    val = kh_value(h, iter);
    // parse the interval
    if (name_end < l) {
        for (i = k = name_end + 1; i < l; ++i)
            if (s[i] != ',') s[k++] = s[i];
        s[k] = 0;
        beg = atoi(s + name_end + 1);
        for (i = name_end + 1; i != k; ++i) if (s[i] == '-') break;
        end = i < k? atoi(s + i + 1) : val.len;
        if (beg > 0) --beg;
    } else beg = 0, end = val.len;
    if (beg >= val.len) beg = val.len;
    if (end >= val.len) end = val.len;
    if (beg > end) beg = end;
    free(s);

    // now retrieve the sequence
    int ret = bgzf_useek(fai->bgzf, val.offset + beg / val.line_blen * val.line_len + beg % val.line_blen, SEEK_SET);
    if ( ret<0 )
    {
        *len = -1;
        fprintf(stderr, "[fai_fetch] Error: fai_fetch failed. (Seeking in a compressed, .gzi unindexed, file?)\n");
        return NULL;
    }
    l = 0;
    s = (char*)malloc(end - beg + 2);
    while ( (c=bgzf_getc(fai->bgzf))>=0 && l < end - beg )
        if (isgraph(c)) s[l++] = c;
    s[l] = '\0';
    *len = l;
    return s;
}